

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult *
iutest::internal::CmpHelperFloatingPointLE<float>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,float val1,float val2)

{
  bool bVar1;
  floating_point<float> *in_RCX;
  string local_c0;
  string local_a0;
  string local_70;
  string local_50;
  floating_point<float> local_30;
  floating_point<float> local_2c;
  floating_point<float> f2;
  floating_point<float> f1;
  float val2_local;
  float val1_local;
  char *expr2_local;
  char *expr1_local;
  
  f2.m_v = (FInt)val2;
  if (val1 < val2) {
    AssertionSuccess();
  }
  else {
    floating_point<float>::floating_point(&local_2c,val1);
    floating_point<float>::floating_point(&local_30,(float)f2.m_v);
    bVar1 = floating_point<float>::AlmostEquals(&local_2c,&local_30);
    if (bVar1) {
      AssertionSuccess();
    }
    else {
      FormatForComparisonFailureMessage<iutest::floating_point<float>,iutest::floating_point<float>>
                (&local_70,(internal *)&local_2c,&local_30,in_RCX);
      detail::ShowStringQuoted(&local_50,&local_70);
      FormatForComparisonFailureMessage<iutest::floating_point<float>,iutest::floating_point<float>>
                (&local_c0,(internal *)&local_30,&local_2c,in_RCX);
      detail::ShowStringQuoted(&local_a0,&local_c0);
      EqFailure(__return_storage_ptr__,expr1,expr2,&local_50,&local_a0,false);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointLE(const char* expr1, const char* expr2
                                                , RawType val1, RawType val2)
{
    if IUTEST_COND_LIKELY( val1 < val2 )
    {
        return AssertionSuccess();
    }
    floating_point<RawType> f1(val1), f2(val2);
    if IUTEST_COND_LIKELY( f1.AlmostEquals(f2) )
    {
        return AssertionSuccess();
    }